

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O1

void WebRtcIsacBw_GetBandwidthInfo
               (BwEstimatorstr *bwest_str,IsacSamplingRate decoder_sample_rate_hz,
               IsacBandwidthInfo *bwinfo)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  
  if ((bwest_str->external_bw_info).in_use == 0) {
    bwinfo->in_use = 1;
    iVar2 = (bwest_str->external_bw_info).in_use;
    if (iVar2 == 0) {
      iVar3 = 56000;
      if ((int)bwest_str->send_bw_avg < 56000) {
        iVar3 = (int)bwest_str->send_bw_avg;
      }
      iVar1 = 10000;
      if (10000 < iVar3) {
        iVar1 = iVar3;
      }
    }
    else {
      iVar1 = (bwest_str->external_bw_info).send_bw_avg;
    }
    bwinfo->send_bw_avg = iVar1;
    if (iVar2 == 0) {
      iVar2 = 0x19;
      if ((int)bwest_str->send_max_delay_avg < 0x19) {
        iVar2 = (int)bwest_str->send_max_delay_avg;
      }
      iVar1 = 5;
      if (5 < iVar2) {
        iVar1 = iVar2;
      }
    }
    else {
      iVar1 = (bwest_str->external_bw_info).send_max_delay_avg;
    }
    bwinfo->send_max_delay_avg = iVar1;
    WebRtcIsac_GetDownlinkBwJitIndexImpl
              (bwest_str,&bwinfo->bottleneck_idx,&bwinfo->jitter_info,decoder_sample_rate_hz);
    return;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0x30d,
                "void WebRtcIsacBw_GetBandwidthInfo(BwEstimatorstr *, enum IsacSamplingRate, IsacBandwidthInfo *)"
               );
}

Assistant:

void WebRtcIsacBw_GetBandwidthInfo(BwEstimatorstr* bwest_str,
                                   enum IsacSamplingRate decoder_sample_rate_hz,
                                   IsacBandwidthInfo* bwinfo) {
  assert(!bwest_str->external_bw_info.in_use);
  bwinfo->in_use = 1;
  bwinfo->send_bw_avg = WebRtcIsac_GetUplinkBandwidth(bwest_str);
  bwinfo->send_max_delay_avg = WebRtcIsac_GetUplinkMaxDelay(bwest_str);
  WebRtcIsac_GetDownlinkBwJitIndexImpl(bwest_str, &bwinfo->bottleneck_idx,
                                       &bwinfo->jitter_info,
                                       decoder_sample_rate_hz);
}